

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ProtobufPrinter::PrintValue<google::protobuf::Enum,void>
               (Enum *value,ostream *os)

{
  string pretty_str;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  google::protobuf::Message::ShortDebugString_abi_cxx11_(&local_38,&value->super_Message);
  if (0x32 < local_38._M_string_length) {
    google::protobuf::Message::DebugString_abi_cxx11_(&sStack_78,&value->super_Message);
    std::operator+(&local_58,"\n",&sStack_78);
    std::__cxx11::string::operator=((string *)&local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&sStack_78);
  }
  std::operator+(&sStack_78,"<",&local_38);
  std::operator+(&local_58,&sStack_78,">");
  std::operator<<(os,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

static void PrintValue(const T& value, ::std::ostream* os) {
    std::string pretty_str = value.ShortDebugString();
    if (pretty_str.length() > kProtobufOneLinerMaxLength) {
      pretty_str = "\n" + value.DebugString();
    }
    *os << ("<" + pretty_str + ">");
  }